

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

size_t __thiscall
llama_context::state_seq_save_file
          (llama_context *this,llama_seq_id seq_id,char *filepath,llama_token *tokens,
          size_t n_token_count)

{
  size_t sVar1;
  llama_file file;
  llama_io_write_file io;
  llama_file local_60;
  llama_io_write_i local_58;
  llama_file *local_50;
  long local_48;
  void *pvStack_40;
  undefined8 local_38;
  long lStack_30;
  
  llama_file::llama_file(&local_60,filepath,"wb");
  llama_file::write_u32(&local_60,0x67677371);
  llama_file::write_u32(&local_60,2);
  llama_file::write_u32(&local_60,(uint32_t)n_token_count);
  llama_file::write_raw(&local_60,tokens,n_token_count * 4);
  local_58._vptr_llama_io_write_i = (_func_int **)&PTR__llama_io_write_file_002865a0;
  local_48 = 0;
  pvStack_40 = (void *)0x0;
  local_38 = 0;
  lStack_30 = 0;
  local_50 = &local_60;
  llama_kv_cache_unified::state_write
            ((this->kv_self)._M_t.
             super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
             ._M_t.
             super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
             .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,&local_58,seq_id);
  (*local_58._vptr_llama_io_write_i[4])();
  sVar1 = llama_file::tell(&local_60);
  if (sVar1 == local_48 + n_token_count * 4 + 0xc) {
    local_58._vptr_llama_io_write_i = (_func_int **)&PTR__llama_io_write_file_002865a0;
    if (pvStack_40 != (void *)0x0) {
      operator_delete(pvStack_40,lStack_30 - (long)pvStack_40);
    }
    llama_file::~llama_file(&local_60);
    return sVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
             ,0x7df,"GGML_ASSERT(%s) failed",
             "res == sizeof(uint32_t) * 3 + sizeof(llama_token) * n_token_count + io.n_bytes()");
}

Assistant:

size_t llama_context::state_seq_save_file(llama_seq_id seq_id, const char * filepath, const llama_token * tokens, size_t n_token_count) {
    llama_file file(filepath, "wb");

    file.write_u32(LLAMA_STATE_SEQ_MAGIC);
    file.write_u32(LLAMA_STATE_SEQ_VERSION);

    // save the prompt
    file.write_u32((uint32_t) n_token_count);
    file.write_raw(tokens, sizeof(llama_token) * n_token_count);

    // save the context state using stream saving
    llama_io_write_file io(&file);
    state_seq_write_data(io, seq_id);

    const size_t res = file.tell();
    GGML_ASSERT(res == sizeof(uint32_t) * 3 + sizeof(llama_token) * n_token_count + io.n_bytes());

    return res;
}